

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ListeningReporter::listTags
          (ListeningReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
          IConfig *config)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter> *listener;
  pointer puVar3;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_listeners).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = puVar3->m_ptr;
    if (pIVar2 == (IStreamingReporter *)0x0) goto LAB_0015dc95;
    (*pIVar2->_vptr_IStreamingReporter[0x16])(pIVar2,tags,config);
  }
  pIVar2 = (this->m_reporter).m_ptr;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*pIVar2->_vptr_IStreamingReporter[0x16])(pIVar2,tags,config);
    return;
  }
LAB_0015dc95:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x4b8,
                "T *Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator->() const [T = Catch::IStreamingReporter]"
               );
}

Assistant:

void ListeningReporter::listTags(std::vector<TagInfo> const &tags, IConfig const &config) {
        for (auto const &listener : m_listeners) {
            listener->listTags(tags, config);
        }
        m_reporter->listTags(tags, config);
    }